

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPxr24Compressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::Pxr24Compressor::compress
          (Pxr24Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  ushort uVar1;
  _Rb_tree_color _Var2;
  Pxr24Compressor *pPVar3;
  uint uVar4;
  int iVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  ConstIterator CVar8;
  BaseExc *this_00;
  uchar *puVar9;
  uint uVar10;
  uchar *puVar11;
  int iVar12;
  uchar *puVar13;
  uchar *puVar14;
  int iVar15;
  uchar *puVar16;
  long lVar17;
  ushort *puVar18;
  uint uVar19;
  bool bVar20;
  anon_union_4_2_947300a4 u;
  double dVar21;
  uLongf outSize;
  ulong local_60;
  Pxr24Compressor *local_58;
  uint local_4c;
  int local_48;
  int local_44;
  char **local_40;
  ulong local_38;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    local_60._0_4_ = 0;
  }
  else {
    local_44 = (range->max).x;
    if (this->_maxX < local_44) {
      local_44 = this->_maxX;
    }
    uVar19 = (range->min).y;
    local_4c = (range->max).y;
    if (this->_maxY < (int)local_4c) {
      local_4c = this->_maxY;
    }
    puVar13 = this->_tmpBuffer;
    local_58 = this;
    local_40 = outPtr;
    if ((int)uVar19 <= (int)local_4c) {
      local_48 = (range->min).x;
      do {
        pPVar3 = local_58;
        cVar6._M_node = (_Base_ptr)ChannelList::begin(local_58->_channels);
        cVar7._M_node = (_Base_ptr)ChannelList::end(pPVar3->_channels);
        if (cVar6._M_node != cVar7._M_node) {
          local_38 = (ulong)~uVar19;
          do {
            uVar10 = *(uint *)&cVar6._M_node[9]._M_parent;
            if ((int)uVar19 < 0) {
              if (-1 < (int)uVar10) {
                uVar4 = ((int)local_38 + uVar10) / uVar10;
                goto LAB_001584fc;
              }
              uVar4 = (~uVar10 - uVar19) / -uVar10;
            }
            else if ((int)uVar10 < 0) {
              uVar4 = uVar19 / -uVar10;
LAB_001584fc:
              uVar4 = -uVar4;
            }
            else {
              uVar4 = uVar19 / uVar10;
            }
            puVar16 = puVar13;
            if (uVar19 == uVar4 * uVar10) {
              iVar5 = numSamples(*(int *)&cVar6._M_node[9].field_0x4,local_48,local_44);
              _Var2 = cVar6._M_node[9]._M_color;
              if (_Var2 == 2) {
                puVar9 = puVar13 + iVar5;
                puVar11 = puVar9 + iVar5;
                puVar16 = puVar11 + iVar5;
                if (0 < iVar5) {
                  iVar12 = 0;
                  uVar10 = 0;
                  do {
                    puVar18 = (ushort *)inPtr;
                    lVar17 = 0;
                    do {
                      *(undefined1 *)((long)&local_60 + lVar17) =
                           *(undefined1 *)((long)puVar18 + lVar17);
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != 4);
                    if ((~(uint)local_60 & 0x7f800000) == 0) {
                      if ((local_60 & 0x7fffff) == 0) {
                        uVar4 = 0x7f8000;
                      }
                      else {
                        uVar4 = (uint)(((uint)local_60 & 0x7fffff) < 0x100) |
                                ((uint)local_60 & 0x7fffff) >> 8 | 0x7f8000;
                      }
                    }
                    else {
                      uVar4 = ((uint)local_60 & 0x80) + ((uint)local_60 & 0x7fffffff);
                      if (0x7f7fffff < uVar4) {
                        uVar4 = (uint)local_60 & 0x7fffffff;
                      }
                      uVar4 = uVar4 >> 8;
                    }
                    uVar4 = (uint)local_60 >> 8 & 0x800000 | uVar4;
                    iVar15 = uVar4 - uVar10;
                    *puVar13 = (uchar)((uint)iVar15 >> 0x10);
                    puVar13 = puVar13 + 1;
                    *puVar9 = (uchar)((uint)iVar15 >> 8);
                    puVar9 = puVar9 + 1;
                    *puVar11 = (uchar)iVar15;
                    puVar11 = puVar11 + 1;
                    iVar12 = iVar12 + 1;
                    inPtr = (char *)(puVar18 + 2);
                    uVar10 = uVar4;
                  } while (iVar12 != iVar5);
                  inPtr = (char *)(puVar18 + 2);
                }
              }
              else if (_Var2 == _S_black) {
                lVar17 = (long)iVar5;
                puVar16 = puVar13 + lVar17 * 2;
                if (0 < iVar5) {
                  uVar10 = 0;
                  do {
                    uVar1 = *(ushort *)inPtr;
                    inPtr = (char *)((long)inPtr + 2);
                    iVar12 = uVar1 - uVar10;
                    *puVar13 = (uchar)((uint)iVar12 >> 8);
                    puVar13[lVar17] = (uchar)iVar12;
                    puVar13 = puVar13 + 1;
                    iVar5 = iVar5 + -1;
                    uVar10 = (uint)uVar1;
                  } while (iVar5 != 0);
                }
              }
              else if (_Var2 == _S_red) {
                puVar9 = puVar13 + iVar5;
                puVar11 = puVar9 + iVar5;
                puVar14 = puVar11 + iVar5;
                puVar16 = puVar14 + iVar5;
                if (0 < iVar5) {
                  iVar15 = 0;
                  iVar12 = 0;
                  do {
                    puVar18 = (ushort *)inPtr;
                    lVar17 = 0;
                    do {
                      *(undefined1 *)((long)&local_60 + lVar17) =
                           *(undefined1 *)((long)puVar18 + lVar17);
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != 4);
                    iVar12 = (uint)local_60 - iVar12;
                    *puVar13 = (uchar)((uint)iVar12 >> 0x18);
                    puVar13 = puVar13 + 1;
                    *puVar9 = (uchar)((uint)iVar12 >> 0x10);
                    puVar9 = puVar9 + 1;
                    *puVar11 = (uchar)((uint)iVar12 >> 8);
                    puVar11 = puVar11 + 1;
                    *puVar14 = (uchar)iVar12;
                    puVar14 = puVar14 + 1;
                    iVar15 = iVar15 + 1;
                    inPtr = (char *)(puVar18 + 2);
                    iVar12 = (uint)local_60;
                  } while (iVar15 != iVar5);
                  inPtr = (char *)(puVar18 + 2);
                }
              }
            }
            puVar13 = puVar16;
            cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
            CVar8 = ChannelList::end(local_58->_channels);
          } while ((const_iterator)cVar6._M_node != CVar8._i._M_node);
        }
        bVar20 = uVar19 != local_4c;
        uVar19 = uVar19 + 1;
      } while (bVar20);
    }
    pPVar3 = local_58;
    puVar16 = local_58->_tmpBuffer;
    lVar17 = (long)puVar13 - (long)puVar16;
    dVar21 = ceil((double)lVar17 * 1.01);
    local_60 = (ulong)((int)dVar21 + 100);
    iVar5 = ::compress(pPVar3->_outBuffer,&local_60,puVar16,lVar17);
    if (iVar5 != 0) {
      this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(this_00,"Data compression (zlib) failed.");
      __cxa_throw(this_00,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
    *local_40 = pPVar3->_outBuffer;
  }
  return (uint)local_60;
}

Assistant:

int
Pxr24Compressor::compress (const char *inPtr,
			   int inSize,
			   Box2i range,
			   const char *&outPtr)
{
    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);

    unsigned char *tmpBufferEnd = _tmpBuffer;

    for (int y = minY; y <= maxY; ++y)
    {
	for (ChannelList::ConstIterator i = _channels.begin();
	     i != _channels.end();
	     ++i)
	{
	    const Channel &c = i.channel();

	    if (modp (y, c.ySampling) != 0)
		continue;

	    int n = numSamples (c.xSampling, minX, maxX);

	    unsigned char *ptr[4];
	    unsigned int previousPixel = 0;

	    switch (c.type)
	    {
	      case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		ptr[3] = ptr[2] + n;
		tmpBufferEnd = ptr[3] + n;

		for (int j = 0; j < n; ++j)
		{
		    unsigned int pixel;
		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*pPtr++ = *inPtr++;

		    unsigned int diff = pixel - previousPixel;
		    previousPixel = pixel;

		    *(ptr[0]++) = diff >> 24;
		    *(ptr[1]++) = diff >> 16;
		    *(ptr[2]++) = diff >> 8;
		    *(ptr[3]++) = diff;
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		tmpBufferEnd = ptr[1] + n;

		for (int j = 0; j < n; ++j)
		{
		    half pixel;

		    pixel = *(const half *) inPtr;
		    inPtr += sizeof (half);

		    unsigned int diff = pixel.bits() - previousPixel;
		    previousPixel = pixel.bits();

		    *(ptr[0]++) = diff >> 8;
		    *(ptr[1]++) = diff;
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		tmpBufferEnd = ptr[2] + n;

		for (int j = 0; j < n; ++j)
		{
		    float pixel;
		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*pPtr++ = *inPtr++;

		    unsigned int pixel24 = floatToFloat24 (pixel);
		    unsigned int diff = pixel24 - previousPixel;
		    previousPixel = pixel24;

		    *(ptr[0]++) = diff >> 16;
		    *(ptr[1]++) = diff >> 8;
		    *(ptr[2]++) = diff;
		}

		break;

	      default:

		assert (false);
	    }
	}
    }

    uLongf outSize = int (ceil ((tmpBufferEnd - _tmpBuffer) * 1.01)) + 100;

    if (Z_OK != ::compress ((Bytef *) _outBuffer,
			    &outSize,
			    (const Bytef *) _tmpBuffer,
			    tmpBufferEnd - _tmpBuffer))
    {
	throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
    }

    outPtr = _outBuffer;
    return outSize;
}